

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShift(TranslateToFuzzReader *this)

{
  SIMDShift *pSVar1;
  Type local_38;
  Expression *local_30;
  Expression *shift;
  Expression *local_20;
  Expression *vec;
  TranslateToFuzzReader *pTStack_10;
  SIMDShiftOp op;
  TranslateToFuzzReader *this_local;
  
  pTStack_10 = this;
  vec._4_4_ = pick<wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp>
                        (this,ShlVecI8x16,ShrSVecI8x16,ShrUVecI8x16,ShlVecI16x8,ShrSVecI16x8,
                         ShrUVecI16x8,ShlVecI32x4,ShrSVecI32x4,ShrUVecI32x4,ShlVecI64x2,ShrSVecI64x2
                         ,ShrUVecI64x2);
  Type::Type((Type *)&shift,v128);
  local_20 = make(this,(Type)shift);
  Type::Type(&local_38,i32);
  local_30 = make(this,local_38);
  pSVar1 = Builder::makeSIMDShift(&this->builder,vec._4_4_,local_20,local_30);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShift() {
  SIMDShiftOp op = pick(ShlVecI8x16,
                        ShrSVecI8x16,
                        ShrUVecI8x16,
                        ShlVecI16x8,
                        ShrSVecI16x8,
                        ShrUVecI16x8,
                        ShlVecI32x4,
                        ShrSVecI32x4,
                        ShrUVecI32x4,
                        ShlVecI64x2,
                        ShrSVecI64x2,
                        ShrUVecI64x2);
  Expression* vec = make(Type::v128);
  Expression* shift = make(Type::i32);
  return builder.makeSIMDShift(op, vec, shift);
}